

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetMethodElement_Int32
              (Var instance,int32 index,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  ScriptContext *scriptContext_local;
  int32 index_local;
  Var instance_local;
  undefined8 local_10;
  
  bVar1 = TaggedInt::IsOverflow(index);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)index,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(index);
  }
  pvVar2 = OP_GetElementI(instance,local_10,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptOperators::OP_GetMethodElement_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetMethodElement_Int32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetMethodElement_Int32, Op_GetMethodElement);
#if FLOATVAR
        return OP_GetElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetMethodElement(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_GetMethodElement_Int32);
    }